

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

XMLDeclaration * __thiscall tinyxml2::XMLDocument::NewDeclaration(XMLDocument *this,char *str)

{
  XMLDeclaration *pXVar1;
  char *str_00;
  
  pXVar1 = CreateUnlinkedNode<tinyxml2::XMLDeclaration,104>(this,&this->_commentPool);
  str_00 = "xml version=\"1.0\" encoding=\"UTF-8\"";
  if (str != (char *)0x0) {
    str_00 = str;
  }
  StrPair::SetStr(&(pXVar1->super_XMLNode)._value,str_00,0);
  return pXVar1;
}

Assistant:

XMLDeclaration* XMLDocument::NewDeclaration(const char* str)
{
    XMLDeclaration* dec = CreateUnlinkedNode<XMLDeclaration>(_commentPool);
    dec->SetValue(str ? str : "xml version=\"1.0\" encoding=\"UTF-8\"");
    return dec;
}